

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O3

Node * prvTidyNewLineNode(Lexer *lexer)

{
  uint uVar1;
  Node *pNVar2;
  
  pNVar2 = (Node *)(*lexer->allocator->vtbl->alloc)(lexer->allocator,0x70);
  pNVar2->parent = (Node *)0x0;
  pNVar2->prev = (Node *)0x0;
  pNVar2->next = (Node *)0x0;
  pNVar2->content = (Node *)0x0;
  pNVar2->last = (Node *)0x0;
  pNVar2->attributes = (AttVal *)0x0;
  pNVar2->was = (Dict *)0x0;
  pNVar2->tag = (Dict *)0x0;
  pNVar2->element = (tmbstr)0x0;
  pNVar2->start = 0;
  pNVar2->end = 0;
  pNVar2->type = RootNode;
  pNVar2->line = 0;
  pNVar2->column = 0;
  pNVar2->idx = 0;
  pNVar2->closed = no;
  pNVar2->implicit = no;
  *(undefined8 *)&pNVar2->linebreak = 0;
  uVar1 = lexer->columns;
  pNVar2->line = lexer->lines;
  pNVar2->column = uVar1;
  pNVar2->type = TextNode;
  pNVar2->start = lexer->lexsize;
  prvTidyAddCharToLexer(lexer,10);
  pNVar2->end = lexer->lexsize;
  return pNVar2;
}

Assistant:

Node *TY_(NewLineNode)( Lexer *lexer )
{
    Node *node = TY_(NewNode)( lexer->allocator, lexer );
    node->start = lexer->lexsize;
    TY_(AddCharToLexer)( lexer, (uint)'\n' );
    node->end = lexer->lexsize;
    return node;
}